

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

int Gia_ManSuppSize(Gia_Man_t *p,int *pNodes,int nNodes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  int nNodes_local;
  int *pNodes_local;
  Gia_Man_t *p_local;
  
  local_30 = 0;
  Gia_ManIncrementTravId(p);
  pGVar2 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar2);
  for (local_2c = 0; local_2c < nNodes; local_2c = local_2c + 1) {
    pGVar2 = Gia_ManObj(p,pNodes[local_2c]);
    iVar1 = Gia_ObjIsCo(pGVar2);
    if (iVar1 == 0) {
      iVar1 = Gia_ManSuppSize_rec(p,pGVar2);
    }
    else {
      pGVar2 = Gia_ObjFanin0(pGVar2);
      iVar1 = Gia_ManSuppSize_rec(p,pGVar2);
    }
    local_30 = iVar1 + local_30;
  }
  return local_30;
}

Assistant:

int Gia_ManSuppSize( Gia_Man_t * p, int * pNodes, int nNodes )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0; 
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = Gia_ManObj( p, pNodes[i] );
        if ( Gia_ObjIsCo(pObj) )
            Counter += Gia_ManSuppSize_rec( p, Gia_ObjFanin0(pObj) );
        else
            Counter += Gia_ManSuppSize_rec( p, pObj );
    }
    return Counter;
}